

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

double mpack_node_double(mpack_node_t node)

{
  int64_t iVar1;
  mpack_error_t mVar2;
  mpack_node_data_t *pmVar3;
  undefined1 auVar4 [16];
  mpack_node_t node_local;
  
  pmVar3 = node.data;
  mVar2 = mpack_node_error(node);
  if (mVar2 == mpack_ok) {
    if (pmVar3->type == mpack_type_uint) {
      iVar1 = (pmVar3->value).i;
      auVar4._8_4_ = (int)((ulong)iVar1 >> 0x20);
      auVar4._0_8_ = iVar1;
      auVar4._12_4_ = 0x45300000;
      node_local.tree =
           (mpack_tree_t *)
           ((auVar4._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0));
    }
    else if (pmVar3->type == mpack_type_int) {
      node_local.tree = (mpack_tree_t *)(double)(pmVar3->value).i;
    }
    else if (pmVar3->type == mpack_type_float) {
      node_local.tree = (mpack_tree_t *)(double)(pmVar3->value).f;
    }
    else if (pmVar3->type == mpack_type_double) {
      node_local.tree = (mpack_tree_t *)(pmVar3->value).children;
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree = (mpack_tree_t *)0x0;
    }
  }
  else {
    node_local.tree = (mpack_tree_t *)0x0;
  }
  return (double)node_local.tree;
}

Assistant:

MPACK_INLINE double mpack_node_double(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0.0;

    if (node.data->type == mpack_type_uint)
        return (double)node.data->value.u;
    else if (node.data->type == mpack_type_int)
        return (double)node.data->value.i;
    else if (node.data->type == mpack_type_float)
        return (double)node.data->value.f;
    else if (node.data->type == mpack_type_double)
        return node.data->value.d;

    mpack_node_flag_error(node, mpack_error_type);
    return 0.0;
}